

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O3

void finish(cs_active *data)

{
  unsigned_long *__ptr;
  
  __ptr = (data->examples_by_queries)._begin;
  if (__ptr != (unsigned_long *)0x0) {
    free(__ptr);
  }
  (data->examples_by_queries)._begin = (unsigned_long *)0x0;
  (data->examples_by_queries)._end = (unsigned_long *)0x0;
  (data->examples_by_queries).end_array = (unsigned_long *)0x0;
  return;
}

Assistant:

void finish(cs_active& data) { data.examples_by_queries.delete_v(); }